

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_combiner.cpp
# Opt level: O3

FilterPushdownResult __thiscall
duckdb::FilterCombiner::TryPushdownOrClause
          (FilterCombiner *this,TableFilterSet *table_filters,
          vector<duckdb::ColumnIndex,_true> *column_ids,Expression *expr)

{
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *this_00;
  _Head_base<0UL,_duckdb::TableFilter_*,_false> _Var1;
  bool bVar2;
  _Head_base<0UL,_duckdb::TableFilter_*,_false> _Var3;
  optional_ptr<duckdb::BoundConstantExpression,_true> oVar4;
  TableFilterSet *this_01;
  ExpressionType type;
  BoundConjunctionExpression *pBVar5;
  TableFilter *this_02;
  reference this_03;
  pointer pEVar6;
  BoundComparisonExpression *pBVar7;
  const_reference pvVar8;
  unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_> uVar9;
  pointer pCVar10;
  BoundColumnRefExpression *this_04;
  pointer pOVar11;
  size_type __n;
  pointer *__ptr;
  FilterPushdownResult FVar12;
  FilterPushdownResult FVar13;
  optional_ptr<duckdb::BoundColumnRefExpression,_true> column_ref;
  optional_ptr<duckdb::BoundConstantExpression,_true> const_val;
  optional_ptr<duckdb::BoundColumnRefExpression,_true> local_b8;
  _Head_base<0UL,_duckdb::TableFilter_*,_false> local_b0;
  optional_ptr<duckdb::BoundConstantExpression,_true> local_a8;
  _Head_base<0UL,_duckdb::TableFilter_*,_false> local_a0;
  _Tuple_impl<0UL,_duckdb::TableFilter_*,_std::default_delete<duckdb::TableFilter>_> local_98;
  vector<duckdb::ColumnIndex,_true> *local_90;
  undefined1 local_88 [64];
  TableFilterSet *local_48;
  BoundConjunctionExpression *local_40;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *local_38;
  
  FVar12 = NO_PUSHDOWN;
  if (((expr->super_BaseExpression).expression_class == BOUND_CONJUNCTION) &&
     (local_90 = column_ids,
     pBVar5 = BaseExpression::Cast<duckdb::BoundConjunctionExpression>(&expr->super_BaseExpression),
     (pBVar5->super_Expression).super_BaseExpression.type == CONJUNCTION_OR)) {
    this_02 = (TableFilter *)operator_new(0x28);
    ConjunctionOrFilter::ConjunctionOrFilter((ConjunctionOrFilter *)this_02);
    local_b0._M_head_impl = this_02;
    if ((pBVar5->children).
        super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (pBVar5->children).
        super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      FVar12 = NO_PUSHDOWN;
    }
    else {
      local_38 = &pBVar5->children;
      local_98.super__Head_base<0UL,_duckdb::TableFilter_*,_false>._M_head_impl =
           (_Head_base<0UL,_duckdb::TableFilter_*,_false>)(TableFilter *)0x0;
      __n = 0;
      local_48 = table_filters;
      local_40 = pBVar5;
      do {
        this_03 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                  ::operator[](local_38,__n);
        pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator->(this_03);
        FVar13 = NO_PUSHDOWN;
        FVar12 = FVar13;
        if ((pEVar6->super_BaseExpression).expression_class != BOUND_COMPARISON) goto LAB_0068e416;
        local_b8.ptr = (BoundColumnRefExpression *)0x0;
        local_a8.ptr = (BoundConstantExpression *)0x0;
        pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator->(this_03);
        pBVar7 = BaseExpression::Cast<duckdb::BoundComparisonExpression>
                           (&pEVar6->super_BaseExpression);
        this_00 = &pBVar7->left;
        pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator->(this_00);
        if ((pEVar6->super_BaseExpression).expression_class == BOUND_COLUMN_REF) {
          pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                   operator->(&pBVar7->right);
          if ((pEVar6->super_BaseExpression).expression_class != BOUND_CONSTANT) goto LAB_0068e164;
          pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                   operator->(this_00);
          local_b8.ptr = BaseExpression::Cast<duckdb::BoundColumnRefExpression>
                                   (&pEVar6->super_BaseExpression);
          pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                   operator->(&pBVar7->right);
          local_a8.ptr = BaseExpression::Cast<duckdb::BoundConstantExpression>
                                   (&pEVar6->super_BaseExpression);
          bVar2 = false;
        }
        else {
LAB_0068e164:
          pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                   operator->(this_00);
          if ((pEVar6->super_BaseExpression).expression_class != BOUND_CONSTANT) goto LAB_0068e416;
          pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                   operator->(&pBVar7->right);
          FVar12 = NO_PUSHDOWN;
          if ((pEVar6->super_BaseExpression).expression_class != BOUND_COLUMN_REF)
          goto LAB_0068e416;
          pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                   operator->(&pBVar7->right);
          local_b8.ptr = BaseExpression::Cast<duckdb::BoundColumnRefExpression>
                                   (&pEVar6->super_BaseExpression);
          pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                   operator->(this_00);
          local_a8.ptr = BaseExpression::Cast<duckdb::BoundConstantExpression>
                                   (&pEVar6->super_BaseExpression);
          bVar2 = true;
        }
        if (__n == 0) {
          optional_ptr<duckdb::BoundColumnRefExpression,_true>::CheckValid(&local_b8);
          pvVar8 = vector<duckdb::ColumnIndex,_true>::operator[]
                             (local_90,((local_b8.ptr)->binding).column_index);
          local_98.super__Head_base<0UL,_duckdb::TableFilter_*,_false>._M_head_impl =
               (_Head_base<0UL,_duckdb::TableFilter_*,_false>)pvVar8->index;
        }
        else {
          optional_ptr<duckdb::BoundColumnRefExpression,_true>::CheckValid(&local_b8);
          pvVar8 = vector<duckdb::ColumnIndex,_true>::operator[]
                             (local_90,((local_b8.ptr)->binding).column_index);
          FVar12 = FVar13;
          if (local_98.super__Head_base<0UL,_duckdb::TableFilter_*,_false>._M_head_impl !=
              (TableFilter *)pvVar8->index) goto LAB_0068e416;
        }
        type = (pBVar7->super_Expression).super_BaseExpression.type;
        if (bVar2) {
          type = FlipComparisonExpression(type);
        }
        optional_ptr<duckdb::BoundConstantExpression,_true>::CheckValid(&local_a8);
        if (((local_a8.ptr)->value).is_null == true) {
          if (type == COMPARE_DISTINCT_FROM) {
            uVar9._M_t.
            super___uniq_ptr_impl<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>.
            _M_t.
            super__Tuple_impl<0UL,_duckdb::TableFilter_*,_std::default_delete<duckdb::TableFilter>_>
            .super__Head_base<0UL,_duckdb::TableFilter_*,_false>._M_head_impl =
                 (__uniq_ptr_data<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true,_true>
                  )operator_new(0x10);
            IsNotNullFilter::IsNotNullFilter
                      ((IsNotNullFilter *)
                       uVar9._M_t.
                       super___uniq_ptr_impl<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_duckdb::TableFilter_*,_std::default_delete<duckdb::TableFilter>_>
                       .super__Head_base<0UL,_duckdb::TableFilter_*,_false>._M_head_impl);
            pCVar10 = unique_ptr<duckdb::ConjunctionOrFilter,_std::default_delete<duckdb::ConjunctionOrFilter>,_true>
                      ::operator->((unique_ptr<duckdb::ConjunctionOrFilter,_std::default_delete<duckdb::ConjunctionOrFilter>,_true>
                                    *)&local_b0);
            local_88._0_8_ =
                 uVar9._M_t.
                 super___uniq_ptr_impl<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::TableFilter_*,_std::default_delete<duckdb::TableFilter>_>
                 .super__Head_base<0UL,_duckdb::TableFilter_*,_false>._M_head_impl;
            ::std::
            vector<duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>,std::allocator<duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>>>
            ::
            emplace_back<duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>>
                      ((vector<duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>,std::allocator<duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>>>
                        *)&(pCVar10->super_ConjunctionFilter).child_filters,
                       (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>
                        *)local_88);
            goto LAB_0068e315;
          }
          if (type == COMPARE_BOUNDARY_END) {
            uVar9._M_t.
            super___uniq_ptr_impl<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>.
            _M_t.
            super__Tuple_impl<0UL,_duckdb::TableFilter_*,_std::default_delete<duckdb::TableFilter>_>
            .super__Head_base<0UL,_duckdb::TableFilter_*,_false>._M_head_impl =
                 (__uniq_ptr_data<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true,_true>
                  )operator_new(0x10);
            IsNullFilter::IsNullFilter
                      ((IsNullFilter *)
                       uVar9._M_t.
                       super___uniq_ptr_impl<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_duckdb::TableFilter_*,_std::default_delete<duckdb::TableFilter>_>
                       .super__Head_base<0UL,_duckdb::TableFilter_*,_false>._M_head_impl);
            pCVar10 = unique_ptr<duckdb::ConjunctionOrFilter,_std::default_delete<duckdb::ConjunctionOrFilter>,_true>
                      ::operator->((unique_ptr<duckdb::ConjunctionOrFilter,_std::default_delete<duckdb::ConjunctionOrFilter>,_true>
                                    *)&local_b0);
            local_88._0_8_ =
                 uVar9._M_t.
                 super___uniq_ptr_impl<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::TableFilter_*,_std::default_delete<duckdb::TableFilter>_>
                 .super__Head_base<0UL,_duckdb::TableFilter_*,_false>._M_head_impl;
            ::std::
            vector<duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>,std::allocator<duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>>>
            ::
            emplace_back<duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>>
                      ((vector<duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>,std::allocator<duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>>>
                        *)&(pCVar10->super_ConjunctionFilter).child_filters,
                       (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>
                        *)local_88);
            goto LAB_0068e315;
          }
        }
        else {
          optional_ptr<duckdb::BoundConstantExpression,_true>::CheckValid(&local_a8);
          oVar4.ptr = local_a8.ptr;
          uVar9._M_t.
          super___uniq_ptr_impl<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>._M_t
          .super__Tuple_impl<0UL,_duckdb::TableFilter_*,_std::default_delete<duckdb::TableFilter>_>.
          super__Head_base<0UL,_duckdb::TableFilter_*,_false>._M_head_impl =
               (__uniq_ptr_data<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true,_true>
                )operator_new(0x50);
          Value::Value((Value *)local_88,&(oVar4.ptr)->value);
          ConstantFilter::ConstantFilter
                    ((ConstantFilter *)
                     uVar9._M_t.
                     super___uniq_ptr_impl<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_duckdb::TableFilter_*,_std::default_delete<duckdb::TableFilter>_>
                     .super__Head_base<0UL,_duckdb::TableFilter_*,_false>._M_head_impl,type,
                     (Value *)local_88);
          Value::~Value((Value *)local_88);
          pCVar10 = unique_ptr<duckdb::ConjunctionOrFilter,_std::default_delete<duckdb::ConjunctionOrFilter>,_true>
                    ::operator->((unique_ptr<duckdb::ConjunctionOrFilter,_std::default_delete<duckdb::ConjunctionOrFilter>,_true>
                                  *)&local_b0);
          local_88._0_8_ =
               uVar9._M_t.
               super___uniq_ptr_impl<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::TableFilter_*,_std::default_delete<duckdb::TableFilter>_>
               .super__Head_base<0UL,_duckdb::TableFilter_*,_false>._M_head_impl;
          ::std::
          vector<duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>,std::allocator<duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>>>
          ::
          emplace_back<duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>>
                    ((vector<duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>,std::allocator<duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>>>
                      *)&(pCVar10->super_ConjunctionFilter).child_filters,
                     (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>
                      *)local_88);
LAB_0068e315:
          if ((ConstantFilter *)local_88._0_8_ != (ConstantFilter *)0x0) {
            (*((TableFilter *)local_88._0_8_)->_vptr_TableFilter[1])();
          }
        }
        __n = __n + 1;
      } while (__n < (ulong)((long)(local_40->children).
                                   super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                   .
                                   super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(local_40->children).
                                   super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                   .
                                   super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3));
      this_04 = (BoundColumnRefExpression *)operator_new(0x18);
      local_88._0_8_ =
           (__uniq_ptr_data<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true,_true>
            )0x0;
      OptionalFilter::OptionalFilter
                ((OptionalFilter *)this_04,
                 (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true> *)
                 local_88);
      this_01 = local_48;
      local_b8.ptr = this_04;
      if ((TableFilter *)local_88._0_8_ != (TableFilter *)0x0) {
        (*(*(_func_int ***)local_88._0_8_)[1])();
      }
      _Var3._M_head_impl = local_b0._M_head_impl;
      local_b0._M_head_impl = (TableFilter *)0x0;
      pOVar11 = unique_ptr<duckdb::OptionalFilter,_std::default_delete<duckdb::OptionalFilter>,_true>
                ::operator->((unique_ptr<duckdb::OptionalFilter,_std::default_delete<duckdb::OptionalFilter>,_true>
                              *)&local_b8);
      _Var1._M_head_impl =
           (pOVar11->child_filter).
           super_unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>._M_t.
           super___uniq_ptr_impl<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>.
           _M_t.
           super__Tuple_impl<0UL,_duckdb::TableFilter_*,_std::default_delete<duckdb::TableFilter>_>.
           super__Head_base<0UL,_duckdb::TableFilter_*,_false>._M_head_impl;
      (pOVar11->child_filter).
      super_unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>._M_t.
      super___uniq_ptr_impl<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::TableFilter_*,_std::default_delete<duckdb::TableFilter>_>.
      super__Head_base<0UL,_duckdb::TableFilter_*,_false>._M_head_impl = _Var3._M_head_impl;
      if (_Var1._M_head_impl != (TableFilter *)0x0) {
        (**(code **)((long)(_Var1._M_head_impl)->_vptr_TableFilter + 8))();
      }
      local_a0._M_head_impl = (TableFilter *)local_b8.ptr;
      local_88._0_8_ = local_98.super__Head_base<0UL,_duckdb::TableFilter_*,_false>._M_head_impl;
      local_88._8_8_ = (element_type *)0x0;
      local_88._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_88._24_8_ = (pointer)0x0;
      local_b8.ptr = (BoundColumnRefExpression *)0x0;
      TableFilterSet::PushFilter
                (this_01,(ColumnIndex *)local_88,
                 (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true> *)
                 &local_a0);
      if ((BoundColumnRefExpression *)local_a0._M_head_impl != (BoundColumnRefExpression *)0x0) {
        (*(((Expression *)&(local_a0._M_head_impl)->_vptr_TableFilter)->super_BaseExpression).
          _vptr_BaseExpression[1])();
      }
      local_a0._M_head_impl = (TableFilter *)0x0;
      ::std::vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>::~vector
                ((vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_> *)(local_88 + 8)
                );
      if (local_b8.ptr != (BoundColumnRefExpression *)0x0) {
        (*((local_b8.ptr)->super_Expression).super_BaseExpression._vptr_BaseExpression[1])();
      }
      FVar12 = PUSHED_DOWN_PARTIALLY;
    }
LAB_0068e416:
    if (local_b0._M_head_impl != (TableFilter *)0x0) {
      (*(((ConjunctionFilter *)&(local_b0._M_head_impl)->_vptr_TableFilter)->super_TableFilter).
        _vptr_TableFilter[1])();
    }
  }
  return FVar12;
}

Assistant:

FilterPushdownResult FilterCombiner::TryPushdownOrClause(TableFilterSet &table_filters,
                                                         const vector<ColumnIndex> &column_ids, Expression &expr) {
	if (expr.GetExpressionClass() != ExpressionClass::BOUND_CONJUNCTION) {
		return FilterPushdownResult::NO_PUSHDOWN;
	}
	auto &conj = expr.Cast<BoundConjunctionExpression>();
	if (conj.GetExpressionType() != ExpressionType::CONJUNCTION_OR) {
		return FilterPushdownResult::NO_PUSHDOWN;
	}
	auto conj_filter = make_uniq<ConjunctionOrFilter>();
	if (conj.children.empty()) {
		return FilterPushdownResult::NO_PUSHDOWN;
	}
	idx_t column_id = 0;
	for (idx_t i = 0; i < conj.children.size(); i++) {
		auto &child = conj.children[i];
		if (child->GetExpressionClass() != ExpressionClass::BOUND_COMPARISON) {
			return FilterPushdownResult::NO_PUSHDOWN;
		}
		optional_ptr<BoundColumnRefExpression> column_ref;
		optional_ptr<BoundConstantExpression> const_val;
		auto &comp = child->Cast<BoundComparisonExpression>();
		bool invert = false;
		if (comp.left->GetExpressionClass() == ExpressionClass::BOUND_COLUMN_REF &&
		    comp.right->GetExpressionClass() == ExpressionClass::BOUND_CONSTANT) {
			column_ref = comp.left->Cast<BoundColumnRefExpression>();
			const_val = comp.right->Cast<BoundConstantExpression>();
		} else if (comp.left->GetExpressionClass() == ExpressionClass::BOUND_CONSTANT &&
		           comp.right->GetExpressionClass() == ExpressionClass::BOUND_COLUMN_REF) {
			column_ref = comp.right->Cast<BoundColumnRefExpression>();
			const_val = comp.left->Cast<BoundConstantExpression>();
			invert = true;
		} else {
			// child of OR filter is not simple so we do not push the or filter down at all
			return FilterPushdownResult::NO_PUSHDOWN;
		}

		if (i == 0) {
			auto &col_id = column_ids[column_ref->binding.column_index];
			column_id = col_id.GetPrimaryIndex();
		} else if (column_id != column_ids[column_ref->binding.column_index].GetPrimaryIndex()) {
			return FilterPushdownResult::NO_PUSHDOWN;
		}

		auto comparison_type = invert ? FlipComparisonExpression(comp.GetExpressionType()) : comp.GetExpressionType();
		if (const_val->value.IsNull()) {
			switch (comparison_type) {
			case ExpressionType::COMPARE_DISTINCT_FROM: {
				auto null_filter = make_uniq<IsNotNullFilter>();
				conj_filter->child_filters.push_back(std::move(null_filter));
				break;
			}
			case ExpressionType::COMPARE_NOT_DISTINCT_FROM: {
				auto null_filter = make_uniq<IsNullFilter>();
				conj_filter->child_filters.push_back(std::move(null_filter));
				break;
			}
			default:
				// if any other comparison type (i.e EQUAL, NOT_EQUAL) do not push a table filter - this is a nop
				// since x = NULL is always falsey, and this is a chain of OR conditions, we can just ignore it
				break;
			}
		} else {
			auto const_filter = make_uniq<ConstantFilter>(comparison_type, const_val->value);
			conj_filter->child_filters.push_back(std::move(const_filter));
		}
	}
	auto optional_filter = make_uniq<OptionalFilter>();
	optional_filter->child_filter = std::move(conj_filter);
	table_filters.PushFilter(ColumnIndex(column_id), std::move(optional_filter));
	return FilterPushdownResult::PUSHED_DOWN_PARTIALLY;
}